

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::RowGroup::read(RowGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::SortingColumn,_true> *this_00;
  vector<duckdb_parquet::ColumnChunk,_true> *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  undefined4 extraout_var;
  reference pvVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  ulong uVar7;
  uint32_t _size140;
  int16_t fid;
  RowGroup *local_a0;
  TType _etype143;
  TType ftype;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  int64_t *local_78;
  int64_t *local_70;
  int64_t *local_68;
  int16_t *local_60;
  int64_t *local_58;
  string fname;
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_02->_vptr_TProtocol[0x19])(this_02,&fname);
  local_60 = &this->ordinal;
  local_68 = &this->total_compressed_size;
  local_58 = &this->file_offset;
  this_00 = &this->sorting_columns;
  local_70 = &this->num_rows;
  local_78 = &this->total_byte_size;
  this_01 = &this->columns;
  local_90 = 0;
  local_88 = 0;
  local_80 = 0;
  local_a0 = this;
  do {
    iVar2 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&fname,&ftype,&fid);
    iVar2 = iVar2 + iVar1;
    if (ftype == T_STOP) {
      iVar1 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      if (((byte)local_90 & (byte)local_88 & (byte)local_80 & 1) == 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar6[1] = puVar6 + 3;
        puVar6[2] = 0;
        *(undefined1 *)(puVar6 + 3) = 0;
        *puVar6 = &PTR__TException_027cc470;
        *(undefined4 *)(puVar6 + 5) = 1;
        __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      std::__cxx11::string::~string((string *)&fname);
      this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar1 + iVar2);
    }
    switch(fid) {
    case 1:
      if (ftype != T_LIST) {
        iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        break;
      }
      std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::clear
                (&this_01->
                  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                );
      iVar3 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype143,&_size140);
      std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::resize
                (&this_01->
                  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                 ,(ulong)_size140);
      iVar3 = iVar3 + iVar2;
      for (uVar7 = 0; uVar7 < _size140; uVar7 = uVar7 + 1) {
        pvVar4 = duckdb::vector<duckdb_parquet::ColumnChunk,_true>::get<true>(this_01,uVar7);
        iVar1 = (**(code **)(*(long *)pvVar4 + 0x10))(pvVar4,this_02);
        iVar3 = iVar3 + iVar1;
      }
      iVar1 = (*this_02->_vptr_TProtocol[0x20])(this_02);
      iVar3 = iVar1 + iVar3;
      local_90 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar1) >> 8),1);
      goto LAB_01dd6263;
    case 2:
      if (ftype == T_I64) {
        iVar1 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_78);
        iVar3 = iVar1 + iVar2;
        local_88 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar1) >> 8),1);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 3:
      if (ftype == T_I64) {
        iVar1 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_70);
        iVar3 = iVar1 + iVar2;
        local_80 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 4:
      if (ftype == T_LIST) {
        std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
        clear(&this_00->
               super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
             );
        iVar1 = (*this_02->_vptr_TProtocol[0x1f])(this_02,&_etype143,&_size140);
        std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
        resize(&this_00->
                super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
               ,(ulong)_size140);
        iVar1 = iVar1 + iVar2;
        for (uVar7 = 0; uVar7 < _size140; uVar7 = uVar7 + 1) {
          pvVar5 = duckdb::vector<duckdb_parquet::SortingColumn,_true>::get<true>(this_00,uVar7);
          iVar2 = (**(code **)(*(long *)pvVar5 + 0x10))(pvVar5,this_02);
          iVar1 = iVar1 + iVar2;
        }
        iVar3 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar3 = iVar3 + iVar1;
        local_a0->__isset = (_RowGroup__isset)((byte)local_a0->__isset | 1);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 5:
      if (ftype == T_I64) {
        iVar3 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_58);
        iVar3 = iVar3 + iVar2;
        local_a0->__isset = (_RowGroup__isset)((byte)local_a0->__isset | 2);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 6:
      if (ftype == T_I64) {
        iVar3 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_68);
        iVar3 = iVar3 + iVar2;
        local_a0->__isset = (_RowGroup__isset)((byte)local_a0->__isset | 4);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 7:
      if (ftype == T_I16) {
        iVar3 = (*this_02->_vptr_TProtocol[0x26])(this_02,local_60);
        iVar3 = iVar3 + iVar2;
        local_a0->__isset = (_RowGroup__isset)((byte)local_a0->__isset | 8);
        goto LAB_01dd6263;
      }
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    default:
      iVar3 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
    }
    iVar3 = iVar3 + iVar2;
LAB_01dd6263:
    iVar1 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar1 = iVar1 + iVar3;
  } while( true );
}

Assistant:

uint32_t RowGroup::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_columns = false;
  bool isset_total_byte_size = false;
  bool isset_num_rows = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->columns.clear();
            uint32_t _size140;
            ::apache::thrift::protocol::TType _etype143;
            xfer += iprot->readListBegin(_etype143, _size140);
            this->columns.resize(_size140);
            uint32_t _i144;
            for (_i144 = 0; _i144 < _size140; ++_i144)
            {
              xfer += this->columns[_i144].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_byte_size);
          isset_total_byte_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->sorting_columns.clear();
            uint32_t _size145;
            ::apache::thrift::protocol::TType _etype148;
            xfer += iprot->readListBegin(_etype148, _size145);
            this->sorting_columns.resize(_size145);
            uint32_t _i149;
            for (_i149 = 0; _i149 < _size145; ++_i149)
            {
              xfer += this->sorting_columns[_i149].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.sorting_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->file_offset);
          this->__isset.file_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          this->__isset.total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I16) {
          xfer += iprot->readI16(this->ordinal);
          this->__isset.ordinal = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_columns)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_byte_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}